

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_table_remove(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  short sVar2;
  TRef TVar3;
  MSize MVar4;
  TRef TVar5;
  IRIns ix_00;
  ptrdiff_t pVar6;
  undefined8 *in_RSI;
  jit_State *in_RDI;
  RecordIndex ix;
  MSize len;
  GCtab *t;
  TRef trlen;
  TRef tab;
  jit_State *in_stack_ffffffffffffff28;
  jit_State *pjVar7;
  GCRef in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff3c;
  jit_State *in_stack_ffffffffffffff40;
  IRIns J_00;
  
  uVar1 = *in_RDI->base;
  in_RSI[1] = 0;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    if ((in_RDI->base[1] & 0x1f000000) != 0) {
      recff_nyiu(in_stack_ffffffffffffff28);
    }
    TVar3 = lj_ir_call(in_RDI,IRCALL_lj_tab_len,(ulong)uVar1);
    ix_00._4_4_ = 0;
    ix_00.field_1.op12 = *(uint *)*in_RSI;
    MVar4 = lj_tab_len((GCtab *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38.gcptr32
                                        ));
    sVar2 = 8;
    if (MVar4 != 0) {
      sVar2 = 9;
    }
    pjVar7 = in_RDI;
    TVar5 = lj_ir_kint(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    (pjVar7->fold).ins.field_0.ot = sVar2 << 8 | 0x93;
    (pjVar7->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (pjVar7->fold).ins.field_0.op2 = (IRRef1)TVar5;
    lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38.gcptr32));
    if (MVar4 != 0) {
      J_00 = (IRIns)&stack0xffffffffffffff38;
      pVar6 = results_wanted(in_RDI);
      if (pVar6 != 0) {
        TVar3 = lj_record_idx((jit_State *)J_00,(RecordIndex *)ix_00);
        *in_RDI->base = TVar3;
        in_RSI[1] = 1;
      }
      lj_record_idx((jit_State *)J_00,(RecordIndex *)ix_00);
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_remove(jit_State *J, RecordFFData *rd)
{
  TRef tab = J->base[0];
  rd->nres = 0;
  if (tref_istab(tab)) {
    if (tref_isnil(J->base[1])) {  /* Simple pop: t[#t] = nil */
      TRef trlen = lj_ir_call(J, IRCALL_lj_tab_len, tab);
      GCtab *t = tabV(&rd->argv[0]);
      MSize len = lj_tab_len(t);
      emitir(IRTGI(len ? IR_NE : IR_EQ), trlen, lj_ir_kint(J, 0));
      if (len) {
	RecordIndex ix;
	ix.tab = tab;
	ix.key = trlen;
	settabV(J->L, &ix.tabv, t);
	setintV(&ix.keyv, len);
	ix.idxchain = 0;
	if (results_wanted(J) != 0) {  /* Specialize load only if needed. */
	  ix.val = 0;
	  J->base[0] = lj_record_idx(J, &ix);  /* Load previous value. */
	  rd->nres = 1;
	  /* Assumes ix.key/ix.tab is not modified for raw lj_record_idx(). */
	}
	ix.val = TREF_NIL;
	lj_record_idx(J, &ix);  /* Remove value. */
      }
    } else {  /* Complex case: remove in the middle. */
      recff_nyiu(J);
    }
  }  /* else: Interpreter will throw. */
}